

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::detail::testing::testCleanUpString
                   (string *__return_storage_ptr__,string *testString,uint32_t commodity)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)testString);
  clean_unit_string(__return_storage_ptr__,&sStack_38,commodity);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
            testCleanUpString(std::string testString, std::uint32_t commodity)
        {
            return clean_unit_string(std::move(testString), commodity);
        }